

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsocketnotifier.cpp
# Opt level: O1

void QSocketNotifier::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QSocketNotifier_to_subr *candidate;
  undefined8 *puVar2;
  undefined4 uVar3;
  InterfaceType *pIVar4;
  int iVar5;
  long in_FS_OFFSET;
  undefined4 local_54;
  undefined1 local_4d;
  undefined4 local_4c;
  void *local_48;
  undefined4 *puStack_40;
  undefined4 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 0) {
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
LAB_002cd1c3:
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSocketDescriptor>::metaType;
      }
      else {
        if (*_a[1] != 1) goto LAB_002cd1ba;
        pIVar4 = &QtPrivate::QMetaTypeInterfaceWrapper<QSocketNotifier::Type>::metaType;
      }
      *puVar2 = pIVar4;
    }
    else {
      if (_id == 1) {
        puVar2 = (undefined8 *)*_a;
        if (*_a[1] == 0) goto LAB_002cd1c3;
      }
      else {
        puVar2 = (undefined8 *)*_a;
      }
LAB_002cd1ba:
      *puVar2 = 0;
    }
    goto LAB_002cd208;
  }
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((code *)*plVar1 == activated) && (uVar3 = 0, plVar1[1] == 0)) ||
       (((code *)*plVar1 == activated && (uVar3 = 2, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_002cd208;
  }
  if (_c != InvokeMetaMethod) goto LAB_002cd208;
  switch(_id) {
  case 0:
    local_4c = *_a[1];
    local_54 = *_a[2];
    puStack_30 = &local_4d;
    iVar5 = 0;
    break;
  case 1:
  case 2:
    local_4c = *_a[1];
    iVar5 = 2;
    break;
  case 3:
    setEnabled((QSocketNotifier *)_o,*_a[1]);
  default:
    goto LAB_002cd208;
  }
  local_38 = &local_54;
  puStack_40 = &local_4c;
  local_48 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_48);
LAB_002cd208:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocketNotifier::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSocketNotifier *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QSocketDescriptor>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSocketNotifier::Type>>(_a[2])), QPrivateSignal()); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QSocketDescriptor>>(_a[1])), QPrivateSignal()); break;
        case 2: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->setEnabled((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketDescriptor >(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketNotifier::Type >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSocketDescriptor >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSocketNotifier::*)(QSocketDescriptor , QSocketNotifier::Type , QPrivateSignal)>(_a, &QSocketNotifier::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSocketNotifier::*)(int , QPrivateSignal)>(_a, &QSocketNotifier::activated, 2))
            return;
    }
}